

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<7,_0,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  undefined8 *puVar1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Vector<float,_3> res;
  Vec4 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  float local_e0 [4];
  float local_d0 [4];
  float local_c0 [4];
  Matrix<float,_3,_3> local_b0;
  Matrix<float,_3,_3> local_8c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  puVar1 = &local_38;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_18 = 0;
  puVar2 = &s_constInMat3;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0x24);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar2 = puVar2 + 1;
  } while (lVar3 != 3);
  increment<float,3,3>(&local_8c,(MatrixCaseUtils *)&local_38,(Matrix<float,_3,_3> *)0x3);
  local_b0.m_data.m_data[0].m_data[2] = 0.0;
  local_b0.m_data.m_data[0].m_data[0] = 0.0;
  local_b0.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    local_b0.m_data.m_data[0].m_data[lVar3] =
         local_8c.m_data.m_data[0].m_data[lVar3] + local_8c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_d0[2] = 0.0;
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  lVar3 = 0;
  do {
    local_d0[lVar3] =
         local_b0.m_data.m_data[0].m_data[lVar3] + local_8c.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  puVar1 = &local_68;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_48 = 0;
  puVar2 = &s_constInMat3;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0x24);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar2 = puVar2 + 1;
  } while (lVar3 != 3);
  increment<float,3,3>(&local_b0,(MatrixCaseUtils *)&local_68,(Matrix<float,_3,_3> *)0x3);
  local_f0 = (ulong)local_f0._4_4_ << 0x20;
  local_f8 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_f8 + lVar3 * 4) =
         local_b0.m_data.m_data[0].m_data[lVar3] + local_b0.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_e0[2] = 0.0;
  local_e0[0] = 0.0;
  local_e0[1] = 0.0;
  lVar3 = 0;
  do {
    local_e0[lVar3] =
         *(float *)((long)&local_f8 + lVar3 * 4) +
         *(float *)((long)(local_8c.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  local_c0[2] = 0.0;
  lVar3 = 0;
  do {
    local_d0[lVar3 + 4] = local_d0[lVar3] + local_e0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_f8 = &evalCtx->color;
  local_f0 = 0x100000000;
  local_e8 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_f8 + lVar3 * 4)] = local_d0[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}